

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O1

var __thiscall
cs_impl::iostream_cs_ext::fstream(iostream_cs_ext *this,string *path,openmode openmode)

{
  basic_ofstream<char,_std::char_traits<char>_> *pbVar1;
  long *plVar2;
  uint *local_48;
  long local_40;
  uint local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  basic_ofstream<char,_std::char_traits<char>_> *local_28;
  
  if ((openmode & _S_in) == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
    if ((openmode & (_S_out|_S_app)) == ~(_S_ios_openmode_min|_S_ios_openmode_max)) {
      plVar2 = (long *)__cxa_allocate_exception(0x20);
      local_48 = &local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"Unsupported openmode.","");
      *plVar2 = (long)(plVar2 + 2);
      if (local_48 == &local_38) {
        *(uint *)(plVar2 + 2) = local_38;
        *(undefined4 *)((long)plVar2 + 0x14) = uStack_34;
        *(undefined4 *)(plVar2 + 3) = uStack_30;
        *(undefined4 *)((long)plVar2 + 0x1c) = uStack_2c;
      }
      else {
        *plVar2 = (long)local_48;
        plVar2[2] = CONCAT44(uStack_34,local_38);
      }
      plVar2[1] = local_40;
      local_40 = 0;
      local_38 = local_38 & 0xffffff00;
      local_48 = &local_38;
      __cxa_throw(plVar2,&cs::lang_error::typeinfo,cs::lang_error::~lang_error);
    }
    pbVar1 = (basic_ofstream<char,_std::char_traits<char>_> *)operator_new(0x200);
    std::ofstream::ofstream(pbVar1,(string *)path,openmode);
    local_28 = pbVar1;
    any::make<std::shared_ptr<std::ostream>,std::ofstream*>((any *)this,&local_28);
  }
  else {
    pbVar1 = (basic_ofstream<char,_std::char_traits<char>_> *)operator_new(0x208);
    std::ifstream::ifstream(pbVar1,(string *)path,openmode);
    local_28 = pbVar1;
    any::make<std::shared_ptr<std::istream>,std::ifstream*>
              ((any *)this,(basic_ifstream<char,_std::char_traits<char>_> **)&local_28);
  }
  return (var)(proxy *)this;
}

Assistant:

var fstream(const string &path, std::ios_base::openmode openmode)
		{
			if (openmode & std::ios_base::in)
				return var::make<istream>(new std::ifstream(path, openmode));
			else if (openmode & std::ios_base::out || openmode & std::ios_base::app)
				return var::make<ostream>(new std::ofstream(path, openmode));
			else
				throw lang_error("Unsupported openmode.");
		}